

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::FinishCCdataM10
          (ithipublisher *this,FILE *F,bool is_svc_list_open,bool *sub_metric_found,
          char **sub_met_name)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  bool local_31;
  int i;
  bool ret;
  char **sub_met_name_local;
  bool *sub_metric_found_local;
  bool is_svc_list_open_local;
  FILE *F_local;
  ithipublisher *this_local;
  
  local_31 = true;
  if (is_svc_list_open) {
    if (is_svc_list_open) {
      iVar1 = fprintf((FILE *)F,"]");
      local_31 = 0 < iVar1;
    }
    sub_metric_found[3] = true;
  }
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    if ((sub_metric_found[local_38] & 1U) == 0) {
      pcVar2 = "0";
      if (local_38 == 3) {
        pcVar2 = "[]";
      }
      iVar1 = fprintf((FILE *)F,",\n\"%s\": %s",sub_met_name[local_38],pcVar2);
      local_31 = (bool)(local_31 & 0 < iVar1);
    }
  }
  iVar1 = fprintf((FILE *)F,"}");
  return (bool)(local_31 & 0 < iVar1);
}

Assistant:

bool ithipublisher::FinishCCdataM10(FILE* F, bool is_svc_list_open, bool sub_metric_found[5], char const * sub_met_name[5])
{
    bool ret = true;
    if (is_svc_list_open)
    {
        if (is_svc_list_open) {
            ret &= fprintf(F, "]") > 0;
        }
        sub_metric_found[3] = true;
    }
    for (int i = 0; i < 5; i++) {
        if (sub_metric_found[i]) {
            continue;
        }
        ret &= fprintf(F, ",\n\"%s\": %s", sub_met_name[i], (i == 3) ? "[]" : "0") > 0;
    }
    ret &= fprintf(F, "}") > 0;
    return ret;
}